

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O3

int UnguessVarType(VARTYPE vartype)

{
  int iVar1;
  
  iVar1 = 0x157;
  if (vartype - VARTYPE_RFA < 0xe) {
    iVar1 = *(int *)(&DAT_0012e0e0 + (ulong)(vartype - VARTYPE_RFA) * 4);
  }
  return iVar1;
}

Assistant:

int UnguessVarType(
	VARTYPE vartype		/**< Type of variable to 
				 * work backwards from. */
)
{
	switch(vartype)
	{
	case VARTYPE_RFA:
		return BAS_S_RFA;
	case VARTYPE_FIXSTR:
	case VARTYPE_DYNSTR:
		return BAS_S_STRING;
	case VARTYPE_BYTE:
		return BAS_S_BYTE;
	case VARTYPE_WORD:
		return BAS_S_WORD;
	case VARTYPE_INTEGER:
		return BAS_S_INTEGER;
	case VARTYPE_LONG:
		return BAS_S_LONG;
	case VARTYPE_SINGLE:
		return BAS_S_SINGLE;
	case VARTYPE_REAL:
		return BAS_S_REAL;
	case VARTYPE_DOUBLE:
		return BAS_S_DOUBLE;
	case VARTYPE_HFLOAT:
		return BAS_S_HFLOAT;
	case VARTYPE_GFLOAT:
		return BAS_S_GFLOAT;
	case VARTYPE_DECIMAL:
		return BAS_S_DECIMAL;
	default:
		return BAS_S_INTEGER;
	}
}